

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfprintf.c
# Opt level: O0

int vfprintf(FILE *__s,char *__format,__gnuc_va_list __arg)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  __va_list_tag *p_Var4;
  char *rc;
  _PDCLIB_status_t status;
  __va_list_tag *arg_local;
  char *format_local;
  _PDCLIB_file_t *stream_local;
  
  rc._0_4_ = 0;
  rc._4_4_ = 0;
  status.base = -1;
  status.flags = -1;
  status.n = 0;
  status.i = 0;
  status.current = 0;
  status.s = (char *)0x0;
  status.width._0_4_ = 0xffffffff;
  status._48_8_ = __s;
  status.arg[0].reg_save_area = __arg;
  mtx_lock((mtx_t *)&__s->_IO_save_base);
  iVar3 = _PDCLIB_prepwrite((_PDCLIB_file_t *)__s);
  if (iVar3 == -1) {
    mtx_unlock((mtx_t *)&__s->_IO_save_base);
    stream_local._4_4_ = -1;
  }
  else {
    status.arg[0].overflow_arg_area = *(void **)((long)status.arg[0].reg_save_area + 0x10);
    status.stream = *status.arg[0].reg_save_area;
    status.arg[0]._0_8_ = *(undefined8 *)((long)status.arg[0].reg_save_area + 8);
    p_Var4 = (__va_list_tag *)__format;
    while (arg_local = p_Var4, (char)arg_local->gp_offset != '\0') {
      if (((char)arg_local->gp_offset != '%') ||
         (p_Var4 = (__va_list_tag *)_PDCLIB_print((char *)arg_local,(_PDCLIB_status_t *)&rc),
         p_Var4 == arg_local)) {
        uVar2 = arg_local->gp_offset;
        pcVar1 = __s->_IO_read_base;
        __s->_IO_read_base = pcVar1 + 1;
        __s->_IO_read_ptr[(long)pcVar1] = (char)uVar2;
        if (((__s->_IO_read_base == __s->_IO_read_end) ||
            (((((ulong)__s->_IO_buf_end & 0x200000000) != 0 && ((char)arg_local->gp_offset == '\n'))
             || (((ulong)__s->_IO_buf_end & 0x400000000) != 0)))) &&
           (iVar3 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__s), iVar3 != 0)) {
          mtx_unlock((mtx_t *)&__s->_IO_save_base);
          return -1;
        }
        status.n = status.n + 1;
        p_Var4 = (__va_list_tag *)((long)&arg_local->gp_offset + 1);
      }
    }
    mtx_unlock((mtx_t *)&__s->_IO_save_base);
    stream_local._4_4_ = (int)status.n;
  }
  return stream_local._4_4_;
}

Assistant:

int vfprintf( struct _PDCLIB_file_t * _PDCLIB_restrict stream, const char * _PDCLIB_restrict format, va_list arg )
{
    /* TODO: This function should interpret format as multibyte characters.  */
    struct _PDCLIB_status_t status;
    status.base = 0;
    status.flags = 0;
    status.n = SIZE_MAX;
    status.i = 0;
    status.current = 0;
    status.s = NULL;
    status.width = 0;
    status.prec = EOF;
    status.stream = stream;

    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepwrite( stream ) == EOF )
    {
        _PDCLIB_UNLOCK( stream->mtx );
        return EOF;
    }

    va_copy( status.arg, arg );

    while ( *format != '\0' )
    {
        const char * rc;

        if ( ( *format != '%' ) || ( ( rc = _PDCLIB_print( format, &status ) ) == format ) )
        {
            /* No conversion specifier, print verbatim */
            stream->buffer[ stream->bufidx++ ] = *format;

            if ( ( stream->bufidx == stream->bufsize )
                 || ( ( stream->status & _IOLBF ) && ( *format == '\n' ) )
                 || ( stream->status & _IONBF )
               )
            {
                if ( _PDCLIB_flushbuffer( stream ) != 0 )
                {
                    _PDCLIB_UNLOCK( stream->mtx );
                    return EOF;
                }
            }

            ++format;
            status.i++;
        }
        else
        {
            /* Continue parsing after conversion specifier */
            format = rc;
        }
    }

    va_end( status.arg );
    _PDCLIB_UNLOCK( stream->mtx );
    return status.i;
}